

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

Logger * Logger::Instance(void)

{
  int iVar1;
  string local_30;
  
  if (Instance()::logger == '\0') {
    iVar1 = __cxa_guard_acquire(&Instance()::logger);
    if (iVar1 != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Verlauf.log","");
      Logger(&Instance::logger,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p);
      }
      __cxa_atexit(~Logger,&Instance::logger,&__dso_handle);
      __cxa_guard_release(&Instance()::logger);
    }
  }
  return &Instance::logger;
}

Assistant:

Logger &Logger::Instance() {
    static Logger logger;

    return logger;
}